

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

void __thiscall despot::BaseRockSample::BaseRockSample(BaseRockSample *this,string *map)

{
  char *pcVar1;
  istream *piVar2;
  size_type sVar3;
  reference coord;
  int *piVar4;
  int local_274;
  int local_270;
  int i;
  undefined8 local_264;
  int local_25c;
  int local_258;
  int c;
  int r;
  char tok;
  string tmp;
  ifstream fin;
  string *map_local;
  BaseRockSample *this_local;
  
  MDP::MDP(&this->super_MDP);
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  *(undefined ***)this = &PTR__BaseRockSample_00149400;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseRockSample_00149518;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseRockSample_00149620;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseRockSample_00149658;
  Grid<int>::Grid(&this->grid_);
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::vector(&this->rock_pos_);
  despot::Coord::Coord(&this->start_pos_);
  MemoryPool<despot::RockSampleState>::MemoryPool(&this->memory_pool_);
  std::vector<despot::RockSampleState_*,_std::allocator<despot::RockSampleState_*>_>::vector
            (&this->states_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->alpha_vectors_);
  std::vector<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>::vector
            (&this->mdp_policy_);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream((void *)((long)&tmp.field_2 + 8),pcVar1,_S_in);
  std::__cxx11::string::string((string *)&r);
  piVar2 = std::operator>>((istream *)(tmp.field_2._M_local_buf + 8),(string *)&r);
  piVar2 = std::operator>>(piVar2,(string *)&r);
  piVar2 = (istream *)std::istream::operator>>(piVar2,&this->size_);
  std::istream::operator>>(piVar2,&this->size_);
  local_258 = this->size_;
  while (local_258 = local_258 + -1, -1 < local_258) {
    for (local_25c = 0; local_25c < this->size_; local_25c = local_25c + 1) {
      std::operator>>((istream *)(tmp.field_2._M_local_buf + 8),(char *)((long)&c + 3));
      if (c._3_1_ == 'R') {
        despot::Coord::Coord((Coord *)&local_264,local_25c,local_258);
        *(undefined8 *)&this->start_pos_ = local_264;
      }
      else if (c._3_1_ == '-') {
        despot::Coord::Coord((Coord *)&i,local_25c,local_258);
        std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back
                  (&this->rock_pos_,(value_type *)&i);
      }
    }
  }
  sVar3 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::size(&this->rock_pos_);
  this->num_rocks_ = (int)sVar3;
  Grid<int>::Resize(&this->grid_,this->size_,this->size_);
  local_270 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_270);
  for (local_274 = 0; local_274 < this->num_rocks_; local_274 = local_274 + 1) {
    coord = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                      (&this->rock_pos_,(long)local_274);
    piVar4 = Grid<int>::operator()(&this->grid_,coord);
    *piVar4 = local_274;
  }
  InitStates(this);
  std::__cxx11::string::~string((string *)&r);
  std::ifstream::~ifstream((void *)((long)&tmp.field_2 + 8));
  return;
}

Assistant:

BaseRockSample::BaseRockSample(string map) {
	ifstream fin(map.c_str(), ifstream::in);
	string tmp;
	fin >> tmp >> tmp >> size_ >> size_;

	char tok;
	for (int r = size_ - 1; r >= 0; r--) {
		for (int c = 0; c < size_; c++) {
			fin >> tok;
			if (tok == 'R')
				start_pos_ = Coord(c, r);
			else if (tok == '-') {
				rock_pos_.push_back(Coord(c, r));
			}
		}
	}
	num_rocks_ = rock_pos_.size();

	grid_.Resize(size_, size_);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rock_pos_[i]) = i;
	}

	InitStates();

	/*
	 clock_t start = clock();
	 cerr << "Initializing transitions" << endl;
	 InitializeTransitions();
	 cerr << "Done " << (double (clock() - start) / CLOCKS_PER_SEC) << endl;
	 ComputeOptimalPolicyUsingVI();
	 */
}